

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

double __thiscall soplex::SSVectorBase<double>::length2(SSVectorBase<double> *this)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  if (this->setupStatus != true) {
    dVar4 = VectorBase<double>::operator*
                      (&this->super_VectorBase<double>,&this->super_VectorBase<double>);
    return dVar4;
  }
  lVar2 = (long)(this->super_IdxSet).num;
  if (0 < lVar2) {
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar1 = (this->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[(this->super_IdxSet).idx[lVar3]];
      dVar4 = dVar4 + dVar1 * dVar1;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    return dVar4;
  }
  return 0.0;
}

Assistant:

R length2() const
   {
      R x = 0;

      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            x += VectorBase<R>::val[idx[i]] * VectorBase<R>::val[idx[i]];
      }
      else
         x = VectorBase<R>::length2();

      return x;
   }